

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScanner::RestorePos(FScanner *this,SavedPos *pos)

{
  char *pcVar1;
  
  pcVar1 = pos->SavedScriptPtr;
  if (pcVar1 != (char *)0x0) {
    this->ScriptPtr = pcVar1;
    this->Line = pos->SavedScriptLine;
  }
  this->End = pcVar1 == (char *)0x0;
  this->AlreadyGot = false;
  this->LastGotToken = false;
  this->Crossed = false;
  return;
}

Assistant:

void FScanner::RestorePos (const FScanner::SavedPos &pos)
{
	if (pos.SavedScriptPtr)
	{
		ScriptPtr = pos.SavedScriptPtr;
		Line = pos.SavedScriptLine;
		End = false;
	}
	else
	{
		End = true;
	}
	AlreadyGot = false;
	LastGotToken = false;
	Crossed = false;
}